

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_vocoder.c
# Opt level: O2

void HTS_movem(double *a,double *b,int nitem)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  
  lVar1 = (long)nitem;
  if (b < a) {
    for (lVar2 = 0; lVar1 != lVar2; lVar2 = lVar2 + 1) {
      b[lVar2] = a[lVar2];
    }
  }
  else {
    while (bVar3 = lVar1 != 0, lVar1 = lVar1 + -1, bVar3) {
      b[lVar1] = a[lVar1];
    }
  }
  return;
}

Assistant:

static void HTS_movem(double *a, double *b, const int nitem)
{
   long i = (long) nitem;

   if (a > b)
      while (i--)
         *b++ = *a++;
   else {
      a += i;
      b += i;
      while (i--)
         *--b = *--a;
   }
}